

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O1

ostream * operator<<(ostream *os,solution *sol)

{
  _Elt_pointer psVar1;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  _Elt_pointer psVar4;
  _Map_pointer ppsVar5;
  step *s;
  _Elt_pointer s_00;
  char local_3a [2];
  solution *local_38;
  
  if (sol->not_found_reason == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"For measuring ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,sol->measure);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," :\n",3);
    s_00 = (sol->current_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
    psVar1 = (sol->current_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    local_38 = sol;
    if (s_00 != psVar1) {
      psVar4 = (sol->current_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      ppsVar5 = (sol->current_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        poVar3 = operator<<(os,s_00);
        local_3a[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3a,1);
        s_00 = s_00 + 1;
        if (s_00 == psVar4) {
          s_00 = ppsVar5[1];
          ppsVar5 = ppsVar5 + 1;
          psVar4 = s_00 + 9;
        }
      } while (s_00 != psVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Wasted water: ",0x10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    __s = local_3a + 1;
    local_3a[1] = 10;
    sVar2 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"No solution found for measurement ",0x22)
    ;
    std::ostream::operator<<((ostream *)os,sol->measure);
    std::__ostream_insert<char,std::char_traits<char>>(os," : ",3);
    __s = sol->not_found_reason;
    if (__s == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
      return os;
    }
    sVar2 = strlen(__s);
    poVar3 = os;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const solution& sol)
{
	if (sol.not_found_reason) {
		os << "No solution found for measurement " << sol.measure;
		os << " : " << sol.not_found_reason;
	}
	else {
		os << "For measuring " << sol.measure << " :\n";
		for (auto&& s : sol.current_steps) {
			os << "  " << s << '\n';
		}
		os << "  Wasted water: " << sol.wastage << '\n';
	}
	return os;
}